

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::CompositePayload
               (AssetResolutionResolver *resolver,Layer *in_layer,Layer *composited_layer,
               string *warn,string *err,PayloadCompositionOptions *options)

{
  bool bVar1;
  ostream *poVar2;
  __node_base *p_Var3;
  bool bVar4;
  ostringstream ss_e;
  Layer dst;
  ostringstream local_17a0 [376];
  Layer local_1628;
  
  if (composited_layer == (Layer *)0x0) {
    bVar4 = false;
  }
  else {
    Layer::Layer(&local_1628,in_layer);
    p_Var3 = &local_1628._prim_specs._M_h._M_before_begin;
    do {
      p_Var3 = p_Var3->_M_nxt;
      bVar4 = p_Var3 == (__node_base *)0x0;
      if (bVar4) {
        Layer::operator=(composited_layer,&local_1628);
        goto LAB_00172450;
      }
      bVar1 = anon_unknown_160::CompositePayloadRec
                        (0,resolver,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_layer,(Layer *)(p_Var3 + 5),(PrimSpec *)warn,err,(string *)options,
                         (PayloadCompositionOptions *)err);
    } while (bVar1);
    ::std::__cxx11::ostringstream::ostringstream(local_17a0);
    poVar2 = ::std::operator<<((ostream *)local_17a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"CompositePayload");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x425);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_17a0,"Composite `payload` failed.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_17a0);
LAB_00172450:
    Layer::~Layer(&local_1628);
  }
  return bVar4;
}

Assistant:

bool CompositePayload(AssetResolutionResolver &resolver, const Layer &in_layer,
                      Layer *composited_layer, std::string *warn,
                      std::string *err, PayloadCompositionOptions options) {
  if (!composited_layer) {
    return false;
  }

  Layer dst = in_layer;  // deep copy

  for (auto &item : dst.primspecs()) {
    if (!CompositePayloadRec(/* depth */ 0, resolver,
                             item.second.get_asset_search_paths(), in_layer, item.second,
                             warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Composite `payload` failed.");
    }
  }

  (*composited_layer) = dst;

  DCOUT("Composite `payload` ok.");
  return true;
}